

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

UnitList * __thiscall
Saturation::SaturationAlgorithm::collectSaturatedSet(SaturationAlgorithm *this)

{
  undefined1 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  List<Kernel::Unit_*> *l;
  ClauseIterator it;
  VirtualIterator<Kernel::Clause_*> local_10;
  
  ActiveClauseContainer::clauses((ActiveClauseContainer *)&stack0xfffffffffffffff0);
  l = (List<Kernel::Unit_*> *)0x0;
  while( true ) {
    iVar2 = (*(local_10._core)->_vptr_IteratorCore[2])();
    if ((char)iVar2 == '\0') break;
    iVar2 = (*(local_10._core)->_vptr_IteratorCore[3])();
    puVar1 = &((Unit *)CONCAT44(extraout_var,iVar2))[1]._inference.field_0x8;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    l = Lib::List<Kernel::Unit_*>::cons((Unit *)CONCAT44(extraout_var,iVar2),l);
  }
  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&stack0xfffffffffffffff0);
  return l;
}

Assistant:

UnitList *SaturationAlgorithm::collectSaturatedSet()
{
  UnitList* res = 0;
  ClauseIterator it = _active->clauses();
  while (it.hasNext()) {
    Clause* cl = it.next();
    cl->incRefCnt();
    UnitList::push(cl, res);
  }
  return res;
}